

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O0

void __thiscall
Diligent::FramebufferBase<Diligent::EngineGLImplTraits>::FramebufferBase
          (FramebufferBase<Diligent::EngineGLImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,FramebufferDesc *Desc,bool bIsDeviceInternal)

{
  ITextureView *pIVar1;
  undefined8 uVar2;
  int iVar3;
  RenderDeviceGLImpl *pDevice_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IMemoryAllocator *pIVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar6;
  undefined4 extraout_var_03;
  Char *pCVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char (*Args_1) [47];
  undefined1 local_180 [8];
  string msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string ViewName;
  string msg_1;
  TextureViewDesc DSVDesc;
  string msg;
  ITextureView *pDepthAttachment;
  SubpassDesc *SubpassDesc;
  Uint32 subpass;
  RenderPassDesc *RPDesc;
  undefined1 local_88 [4];
  Uint32 i_1;
  MipLevelProperties MipLevelProps;
  TextureDesc *TexDesc;
  TextureViewDesc *ViewDesc;
  ITextureView *pAttachment;
  Uint32 i;
  bool bIsDeviceInternal_local;
  FramebufferDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  FramebufferBase<Diligent::EngineGLImplTraits> *this_local;
  long lVar4;
  
  DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  ).super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_0058f7a8;
  this->m_ppAttachments = (ITextureView **)0x0;
  this->m_ppReadOnlyDSVs = (ITextureView **)0x0;
  pDevice_00 = DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
               ::GetDevice(&this->
                            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                          );
  ValidateFramebufferDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc,(IRenderDevice *)pDevice_00);
  if ((((this->
        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
        ).m_Desc.Width == 0) ||
      ((this->
       super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
       ).m_Desc.Height == 0)) ||
     ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.NumArraySlices == 0)) {
    for (pAttachment._0_4_ = 0;
        (uint)pAttachment <
        (this->
        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
        ).m_Desc.AttachmentCount; pAttachment._0_4_ = (uint)pAttachment + 1) {
      pIVar1 = Desc->ppAttachments[(uint)pAttachment];
      if (pIVar1 != (ITextureView *)0x0) {
        iVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        lVar4 = CONCAT44(extraout_var,iVar3);
        if (*(char *)(lVar4 + 8) != '\x06') {
          iVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[10])();
          MipLevelProps.MipSize = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x20))();
          GetMipLevelProperties
                    ((MipLevelProperties *)local_88,(TextureDesc *)MipLevelProps.MipSize,
                     *(Uint32 *)(lVar4 + 0xc));
          if ((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.Width == 0) {
            (this->
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            ).m_Desc.Width = (Uint32)local_88;
          }
          if ((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.Height == 0) {
            (this->
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            ).m_Desc.Height = i_1;
          }
          if ((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.NumArraySlices == 0) {
            (this->
            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
            ).m_Desc.NumArraySlices = *(Uint32 *)(lVar4 + 0x18);
          }
        }
      }
    }
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.Width == 0) {
    LogError<true,char[105]>
              (false,"FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0x68,(char (*) [105])
                     "The framebuffer width is zero and can\'t be automatically determined as there are no non-null attachments"
              );
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.Height == 0) {
    LogError<true,char[106]>
              (false,"FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0x6a,(char (*) [106])
                     "The framebuffer height is zero and can\'t be automatically determined as there are no non-null attachments"
              );
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.NumArraySlices == 0) {
    LogError<true,char[117]>
              (false,"FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0x6c,(char (*) [117])
                     "The framebuffer array slice count is zero and can\'t be automatically determined as there are no non-null attachments"
              );
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ).m_Desc.AttachmentCount != 0) {
    pIVar5 = GetRawAllocator();
    iVar3 = (**pIVar5->_vptr_IMemoryAllocator)
                      (pIVar5,(ulong)(this->
                                     super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                                     ).m_Desc.AttachmentCount << 3,
                       "Memory for framebuffer attachment array",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                       ,0x71);
    this->m_ppAttachments = (ITextureView **)CONCAT44(extraout_var_01,iVar3);
    (this->
    super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
    ).m_Desc.ppAttachments = this->m_ppAttachments;
    for (RPDesc._4_4_ = 0;
        RPDesc._4_4_ <
        (this->
        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
        ).m_Desc.AttachmentCount; RPDesc._4_4_ = RPDesc._4_4_ + 1) {
      if (Desc->ppAttachments[RPDesc._4_4_] != (ITextureView *)0x0) {
        this->m_ppAttachments[RPDesc._4_4_] = Desc->ppAttachments[RPDesc._4_4_];
        (*(this->m_ppAttachments[RPDesc._4_4_]->super_IDeviceObject).super_IObject._vptr_IObject[1])
                  ();
      }
    }
  }
  (*(Desc->pRenderPass->super_IDeviceObject).super_IObject._vptr_IObject[1])();
  iVar3 = (*(((this->
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar4 = CONCAT44(extraout_var_02,iVar3);
  for (SubpassDesc._4_4_ = 0; SubpassDesc._4_4_ < *(uint *)(lVar4 + 0x18);
      SubpassDesc._4_4_ = SubpassDesc._4_4_ + 1) {
    lVar6 = *(long *)(lVar4 + 0x20) + (ulong)SubpassDesc._4_4_ * 0x48;
    if (((*(long *)(lVar6 + 0x28) != 0) && (**(int **)(lVar6 + 0x28) != -1)) &&
       (*(int *)(*(long *)(lVar6 + 0x28) + 4) == 0x80)) {
      if (this->m_ppReadOnlyDSVs == (ITextureView **)0x0) {
        pIVar5 = GetRawAllocator();
        iVar3 = (**pIVar5->_vptr_IMemoryAllocator)
                          (pIVar5,(ulong)*(uint *)(lVar4 + 0x18) << 3,
                           "Memory for read-only depth attachment array",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                           ,0x8e);
        this->m_ppReadOnlyDSVs = (ITextureView **)CONCAT44(extraout_var_03,iVar3);
        memset(this->m_ppReadOnlyDSVs,0,(ulong)*(uint *)(lVar4 + 0x18) << 3);
      }
      Args_1 = (char (*) [47])(ulong)**(uint **)(lVar6 + 0x28);
      pIVar1 = this->m_ppAttachments[(long)Args_1];
      if (pIVar1 == (ITextureView *)0x0) {
        FormatString<char[26],char[28]>
                  ((string *)&DSVDesc.Swizzle.B,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pDepthAttachment != nullptr",(char (*) [28])Args_1);
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        Args_1 = (char (*) [47])0x93;
        DebugAssertionFailed
                  (pCVar7,"FramebufferBase",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                   ,0x93);
        std::__cxx11::string::~string((string *)&DSVDesc.Swizzle.B);
      }
      iVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      memcpy((void *)((long)&msg_1.field_2 + 8),(void *)CONCAT44(extraout_var_04,iVar3),0x28);
      if ((char)DSVDesc.super_DeviceObjectAttribs.Name == '\x04') {
        this->m_ppReadOnlyDSVs[SubpassDesc._4_4_] = pIVar1;
        (*(this->m_ppReadOnlyDSVs[SubpassDesc._4_4_]->super_IDeviceObject).super_IObject.
          _vptr_IObject[1])();
      }
      else {
        if ((char)DSVDesc.super_DeviceObjectAttribs.Name != '\x03') {
          FormatString<char[26],char[47]>
                    ((string *)((long)&ViewName.field_2 + 8),
                     (Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"DSVDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL",Args_1);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"FramebufferBase",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                     ,0x9e);
          std::__cxx11::string::~string((string *)(ViewName.field_2._M_local_buf + 8));
        }
        uVar2 = msg_1.field_2._8_8_;
        DSVDesc.super_DeviceObjectAttribs.Name._0_1_ = '\x04';
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_158,(char *)uVar2,
                   (allocator *)(msg_2.field_2._M_local_buf + 0xf));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_158," (read-only)");
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)(msg_2.field_2._M_local_buf + 0xf));
        msg_1.field_2._8_8_ = std::__cxx11::string::c_str();
        iVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[10])();
        (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x40))
                  ((long *)CONCAT44(extraout_var_05,iVar3),(undefined1 *)((long)&msg_1.field_2 + 8),
                   this->m_ppReadOnlyDSVs + SubpassDesc._4_4_);
        if (this->m_ppReadOnlyDSVs[(long)(ulong)SubpassDesc._4_4_] == (ITextureView *)0x0) {
          FormatString<char[26],char[37]>
                    ((string *)local_180,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"m_ppReadOnlyDSVs[subpass] != nullptr",
                     (char (*) [37])(ulong)SubpassDesc._4_4_);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"FramebufferBase",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                     ,0xa3);
          std::__cxx11::string::~string((string *)local_180);
        }
        std::__cxx11::string::~string((string *)local_138);
      }
    }
  }
  return;
}

Assistant:

FramebufferBase(IReferenceCounters*    pRefCounters,
                    RenderDeviceImplType*  pDevice,
                    const FramebufferDesc& Desc,
                    bool                   bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        ValidateFramebufferDesc(this->m_Desc, this->GetDevice());

        if (this->m_Desc.Width == 0 || this->m_Desc.Height == 0 || this->m_Desc.NumArraySlices == 0)
        {
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                auto* const pAttachment = Desc.ppAttachments[i];
                if (pAttachment == nullptr)
                    continue;

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
                {
                    // Dimensions of the shading rate texture are less than the dimensions of other attachments
                    // and can't be used to compute the frame buffer size.
                    continue;
                }

                const auto& TexDesc       = pAttachment->GetTexture()->GetDesc();
                const auto  MipLevelProps = GetMipLevelProperties(TexDesc, ViewDesc.MostDetailedMip);
                if (this->m_Desc.Width == 0)
                    this->m_Desc.Width = MipLevelProps.LogicalWidth;
                if (this->m_Desc.Height == 0)
                    this->m_Desc.Height = MipLevelProps.LogicalHeight;
                if (this->m_Desc.NumArraySlices == 0)
                    this->m_Desc.NumArraySlices = ViewDesc.NumArraySlices;
            }
        }

        // It is legal for a subpass to use no color or depth/stencil attachments, either because it has no attachment
        // references or because all of them are VK_ATTACHMENT_UNUSED. This kind of subpass can use shader side effects
        // such as image stores and atomics to produce an output. In this case, the subpass continues to use the width,
        // height, and layers of the framebuffer to define the dimensions of the rendering area.
        if (this->m_Desc.Width == 0)
            LOG_ERROR_AND_THROW("The framebuffer width is zero and can't be automatically determined as there are no non-null attachments");
        if (this->m_Desc.Height == 0)
            LOG_ERROR_AND_THROW("The framebuffer height is zero and can't be automatically determined as there are no non-null attachments");
        if (this->m_Desc.NumArraySlices == 0)
            LOG_ERROR_AND_THROW("The framebuffer array slice count is zero and can't be automatically determined as there are no non-null attachments");

        if (this->m_Desc.AttachmentCount > 0)
        {
            m_ppAttachments =
                ALLOCATE(GetRawAllocator(), "Memory for framebuffer attachment array", ITextureView*, this->m_Desc.AttachmentCount);
            this->m_Desc.ppAttachments = m_ppAttachments;
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                if (Desc.ppAttachments[i] == nullptr)
                    continue;

                m_ppAttachments[i] = Desc.ppAttachments[i];
                m_ppAttachments[i]->AddRef();
            }
        }

        Desc.pRenderPass->AddRef();

        // Create read-only depth views for read-write depth attachments, if needed
        const RenderPassDesc& RPDesc = this->m_Desc.pRenderPass->GetDesc();
        for (Uint32 subpass = 0; subpass < RPDesc.SubpassCount; ++subpass)
        {
            const auto& SubpassDesc = RPDesc.pSubpasses[subpass];
            if (SubpassDesc.pDepthStencilAttachment == nullptr)
                continue;
            if (SubpassDesc.pDepthStencilAttachment->AttachmentIndex == ATTACHMENT_UNUSED)
                continue;
            if (SubpassDesc.pDepthStencilAttachment->State != RESOURCE_STATE_DEPTH_READ)
                continue;

            if (m_ppReadOnlyDSVs == nullptr)
            {
                m_ppReadOnlyDSVs =
                    ALLOCATE(GetRawAllocator(), "Memory for read-only depth attachment array", ITextureView*, RPDesc.SubpassCount);
                memset(m_ppReadOnlyDSVs, 0, sizeof(m_ppReadOnlyDSVs[0]) * RPDesc.SubpassCount);
            }

            auto* pDepthAttachment = m_ppAttachments[SubpassDesc.pDepthStencilAttachment->AttachmentIndex];
            VERIFY_EXPR(pDepthAttachment != nullptr);

            auto DSVDesc = pDepthAttachment->GetDesc();
            if (DSVDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            {
                m_ppReadOnlyDSVs[subpass] = pDepthAttachment;
                m_ppReadOnlyDSVs[subpass]->AddRef();
            }
            else
            {
                // Create read-only depth view for this attachment
                VERIFY_EXPR(DSVDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
                DSVDesc.ViewType     = TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
                std::string ViewName = std::string{DSVDesc.Name} + " (read-only)";
                DSVDesc.Name         = ViewName.c_str();
                pDepthAttachment->GetTexture()->CreateView(DSVDesc, &m_ppReadOnlyDSVs[subpass]);
                VERIFY_EXPR(m_ppReadOnlyDSVs[subpass] != nullptr);
            }
        }
    }